

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone_partitioning.cc
# Opt level: O0

void __thiscall
PolygonTriangulation::build_monotone_chains
          (PolygonTriangulation *this,Monochain_t *monochain,uint32_t trapezoid_index,
          uint32_t from_index,bool go_down)

{
  reference trapezoid_00;
  bool local_61;
  bool local_52;
  bool come_from_left;
  value_type *trapezoid;
  reference local_38;
  byte local_21;
  uint32_t local_20;
  uint32_t uStack_1c;
  bool go_down_local;
  uint32_t from_index_local;
  uint32_t trapezoid_index_local;
  Monochain_t *monochain_local;
  PolygonTriangulation *this_local;
  
  local_52 = true;
  local_21 = go_down;
  local_20 = from_index;
  uStack_1c = trapezoid_index;
  _from_index_local = monochain;
  monochain_local = (Monochain_t *)this;
  if (trapezoid_index != 0xffffffff) {
    local_38 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&this->visited_trapezoids_,(ulong)trapezoid_index);
    local_52 = std::_Bit_reference::operator_cast_to_bool(&local_38);
  }
  if (local_52 == false) {
    _trapezoid = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&this->visited_trapezoids_,(ulong)uStack_1c);
    std::_Bit_reference::operator=((_Bit_reference *)&trapezoid,true);
    trapezoid_00 = std::
                   vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
                   ::operator[](&this->trapezoids_,(ulong)uStack_1c);
    local_61 = true;
    if (local_20 != trapezoid_00->above1) {
      local_61 = local_20 == trapezoid_00->below1;
    }
    add_vertex_to_monochain(this,trapezoid_00,(bool)(local_21 & 1),_from_index_local);
    select_monotone_path(this,uStack_1c,(bool)(local_21 & 1),local_61);
    if ((local_21 & 1) == 0) {
      build_monotone_chains(this,_from_index_local,trapezoid_00->above1,uStack_1c,false);
      build_monotone_chains(this,_from_index_local,trapezoid_00->above2,uStack_1c,false);
    }
    else {
      build_monotone_chains(this,_from_index_local,trapezoid_00->below1,uStack_1c,true);
      build_monotone_chains(this,_from_index_local,trapezoid_00->below2,uStack_1c,true);
    }
  }
  return;
}

Assistant:

void PolygonTriangulation::build_monotone_chains(
    Monochain_t *monochain,
    const uint32_t trapezoid_index,
    const uint32_t from_index,
    const bool go_down
) {
  if ((kInvalidIndex == trapezoid_index)
   || (visited_trapezoids_[trapezoid_index])) {
    return;
  }
  visited_trapezoids_[trapezoid_index] = true;

  const auto &trapezoid = trapezoids_[trapezoid_index];

  // Determine if the current search come from the first children of the trapezoids.
  const bool come_from_left = (from_index == trapezoid.above1)
                                                        || (from_index == trapezoid.below1);

  add_vertex_to_monochain(trapezoid, go_down, monochain);
  select_monotone_path(trapezoid_index, go_down, come_from_left);

  // Continue in the same direction.
  if (go_down) {
    build_monotone_chains(monochain, trapezoid.below1, trapezoid_index, true);
    build_monotone_chains(monochain, trapezoid.below2, trapezoid_index, true);
  } else {
    build_monotone_chains(monochain, trapezoid.above1, trapezoid_index, false);
    build_monotone_chains(monochain, trapezoid.above2, trapezoid_index, false);
  }
}